

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O3

int __thiscall connector::close(connector *this,int __fd)

{
  int in_EAX;
  int iVar1;
  
  if (this->connected_ == true) {
    iVar1 = session::close(&this->super_session,__fd);
    return iVar1;
  }
  if (-1 < this->connectfd_) {
    network::del_event((this->super_session).network_,(iobject *)this,this->connectfd_,
                       (this->super_session).super_iobject.events_);
    in_EAX = close_socket(this->connectfd_);
    this->connectfd_ = -1;
    this->connected_ = false;
  }
  return in_EAX;
}

Assistant:

void connector::close()
{
    if (connected_)
    {
        session::close();
        return;
    }

    if (connectfd_ >= 0)
    {
        network_->del_event(this, connectfd_, events_);
        close_socket(connectfd_);
        connectfd_ = -1;
        connected_ = false;
    }
}